

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.h
# Opt level: O2

XXH64_hash_t
XXH3_64bits_internal
          (void *input,size_t len,XXH64_hash_t seed64,void *secret,size_t secretLen,
          XXH3_hashLong64_f f_hashLong)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint uVar3;
  xxh_u64 xVar4;
  XXH64_hash_t XVar5;
  ulong uVar6;
  long lVar7;
  xxh_u8 *input_00;
  ulong uVar8;
  xxh_u64 xVar9;
  xxh_u8 *secret_00;
  bool bVar10;
  
  if (len < 0x11) {
    if (len < 9) {
      if (len < 4) {
        if (len == 0) {
          xVar9 = *(ulong *)((long)secret + 0x38) ^ *(ulong *)((long)secret + 0x40) ^ seed64;
        }
        else {
          xVar9 = (*(uint *)((long)secret + 4) ^ *secret) + seed64 ^
                  (len << 8 | (ulong)*input << 0x10 |
                   (ulong)*(byte *)((long)input + (len >> 1)) << 0x18 |
                  (ulong)*(byte *)((long)input + (len - 1)));
        }
        xVar9 = XXH64_avalanche(xVar9);
        return xVar9;
      }
      uVar3 = (uint)seed64;
      uVar6 = CONCAT44(*input,*(undefined4 *)((long)input + (len - 4))) ^
              (*(ulong *)((long)secret + 0x10) ^ *(ulong *)((long)secret + 8)) -
              ((ulong)(uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 |
                      uVar3 << 0x18) << 0x20 ^ seed64);
      uVar6 = ((uVar6 << 0x18 | uVar6 >> 0x28) ^ (uVar6 << 0x31 | uVar6 >> 0xf) ^ uVar6) *
              -0x604de39ae16720db;
      uVar8 = ((uVar6 >> 0x23) + len ^ uVar6) * -0x604de39ae16720db;
      uVar6 = uVar8 >> 0x1c;
      goto LAB_0010f2de;
    }
    uVar8 = (*(ulong *)((long)secret + 0x20) ^ *(ulong *)((long)secret + 0x18)) + seed64 ^ *input;
    uVar6 = (*(ulong *)((long)secret + 0x30) ^ *(ulong *)((long)secret + 0x28)) - seed64 ^
            *(ulong *)((long)input + (len - 8));
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar6;
    auVar2._8_8_ = 0;
    auVar2._0_8_ = uVar8;
    uVar6 = (SUB168(auVar1 * auVar2,8) ^ SUB168(auVar1 * auVar2,0)) +
            len + uVar6 +
            (uVar8 >> 0x38 | (uVar8 & 0xff000000000000) >> 0x28 | (uVar8 & 0xff0000000000) >> 0x18 |
             (uVar8 & 0xff00000000) >> 8 | (uVar8 & 0xff000000) << 8 | (uVar8 & 0xff0000) << 0x18 |
             (uVar8 & 0xff00) << 0x28 | uVar8 << 0x38);
    uVar6 = uVar6 >> 0x25 ^ uVar6;
    uVar8 = 0x165667919e3779f9;
  }
  else {
    if (len < 0x81) {
      lVar7 = len * -0x61c8864e7a143579;
      if (0x20 < len) {
        if (0x40 < len) {
          if (0x60 < len) {
            xVar9 = XXH3_mix16B((xxh_u8 *)((long)input + 0x30),(xxh_u8 *)((long)secret + 0x60),
                                seed64);
            xVar4 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x40)),
                                (xxh_u8 *)((long)secret + 0x70),seed64);
            lVar7 = lVar7 + xVar4 + xVar9;
          }
          xVar9 = XXH3_mix16B((xxh_u8 *)((long)input + 0x20),(xxh_u8 *)((long)secret + 0x40),seed64)
          ;
          xVar4 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x30)),(xxh_u8 *)((long)secret + 0x50)
                              ,seed64);
          lVar7 = lVar7 + xVar4 + xVar9;
        }
        xVar9 = XXH3_mix16B((xxh_u8 *)((long)input + 0x10),(xxh_u8 *)((long)secret + 0x20),seed64);
        xVar4 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x20)),(xxh_u8 *)((long)secret + 0x30),
                            seed64);
        lVar7 = lVar7 + xVar4 + xVar9;
      }
      xVar9 = XXH3_mix16B((xxh_u8 *)input,(xxh_u8 *)secret,seed64);
      xVar4 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x10)),(xxh_u8 *)((long)secret + 0x10),
                          seed64);
      uVar6 = xVar4 + xVar9 + lVar7;
      uVar6 = (uVar6 >> 0x25 ^ uVar6) * 0x165667919e3779f9;
      return uVar6 >> 0x20 ^ uVar6;
    }
    if (0xf0 < len) {
      XVar5 = (*f_hashLong)(input,len,seed64,(xxh_u8 *)secret,secretLen);
      return XVar5;
    }
    uVar6 = len * -0x61c8864e7a143579;
    for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 0x10) {
      xVar9 = XXH3_mix16B((xxh_u8 *)(lVar7 + (long)input),(xxh_u8 *)((long)secret + lVar7),seed64);
      uVar6 = uVar6 + xVar9;
    }
    uVar6 = (uVar6 >> 0x25 ^ uVar6) * 0x165667919e3779f9;
    uVar6 = uVar6 >> 0x20 ^ uVar6;
    lVar7 = (len >> 4) - 8;
    secret_00 = (xxh_u8 *)((long)secret + 3);
    input_00 = (xxh_u8 *)((long)input + 0x80);
    while (bVar10 = lVar7 != 0, lVar7 = lVar7 + -1, bVar10) {
      xVar9 = XXH3_mix16B(input_00,secret_00,seed64);
      uVar6 = uVar6 + xVar9;
      secret_00 = secret_00 + 0x10;
      input_00 = input_00 + 0x10;
    }
    xVar9 = XXH3_mix16B((xxh_u8 *)((long)input + (len - 0x10)),(xxh_u8 *)((long)secret + 0x77),
                        seed64);
    uVar8 = xVar9 + uVar6 >> 0x25 ^ xVar9 + uVar6;
    uVar6 = 0x165667919e3779f9;
  }
  uVar8 = uVar8 * uVar6;
  uVar6 = uVar8 >> 0x20;
LAB_0010f2de:
  return uVar6 ^ uVar8;
}

Assistant:

XXH_FORCE_INLINE XXH64_hash_t
XXH3_64bits_internal(const void* XXH_RESTRICT input, size_t len,
                     XXH64_hash_t seed64, const void* XXH_RESTRICT secret,
                     size_t secretLen, XXH3_hashLong64_f f_hashLong) {
  XXH_ASSERT(secretLen >= XXH3_SECRET_SIZE_MIN);
  /*
   * If an action is to be taken if `secretLen` condition is not respected,
   * it should be done here.
   * For now, it's a contract pre-condition.
   * Adding a check and a branch here would cost performance at every hash.
   * Also, note that function signature doesn't offer room to return an error.
   */
  if (len <= 16)
    return XXH3_len_0to16_64b((const xxh_u8*)input, len, (const xxh_u8*)secret,
                              seed64);
  if (len <= 128)
    return XXH3_len_17to128_64b((const xxh_u8*)input, len,
                                (const xxh_u8*)secret, secretLen, seed64);
  if (len <= XXH3_MIDSIZE_MAX)
    return XXH3_len_129to240_64b((const xxh_u8*)input, len,
                                 (const xxh_u8*)secret, secretLen, seed64);
  return f_hashLong(input, len, seed64, (const xxh_u8*)secret, secretLen);
}